

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVariable.cpp
# Opt level: O2

string * __thiscall
hdc::LocalVariable::getUniqueCppName_abi_cxx11_(string *__return_storage_ptr__,LocalVariable *this)

{
  ostream *poVar1;
  string local_1c0;
  stringstream s;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar1 = std::operator<<(local_190,"lv");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Variable).localName);
  poVar1 = std::operator<<(poVar1,'_');
  Variable::getName_abi_cxx11_(&local_1c0,&this->super_Variable);
  std::operator<<(poVar1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string LocalVariable::getUniqueCppName() {
    std::stringstream s;

    s << "lv" << localName << '_' << getName();
    return s.str();
}